

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Ceiling_CrushStop
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  undefined1 local_29;
  bool remove;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (arg3 == 1) {
    local_29 = false;
  }
  else if (arg3 == 2) {
    local_29 = true;
  }
  else {
    local_29 = gameinfo.gametype == GAME_Hexen;
  }
  bVar1 = EV_CeilingCrushStop(arg0,local_29);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Ceiling_CrushStop)
// Ceiling_CrushStop (tag, remove)
{
	bool remove;
	switch (arg3)
	{
	case 1:
		remove = false;
		break;
	case 2:
		remove = true;
		break;
	default:
		remove = gameinfo.gametype == GAME_Hexen;
		break;
	}
	return EV_CeilingCrushStop (arg0, remove);
}